

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPetNet.cpp
# Opt level: O3

void __thiscall NaPetriNet::add(NaPetriNet *this,NaPetriNode *pNode)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  char *pcVar4;
  char *pcVar5;
  NaPetriConnector *pNVar6;
  undefined8 *puVar7;
  uint uVar8;
  ulong uVar9;
  char *pcVar10;
  FILE *pFVar11;
  int iVar12;
  
  if (0 < (this->pnaNet).nItems) {
    uVar9 = 0;
    do {
      iVar1 = (*(this->pnaNet)._vptr_NaDynAr[0xf])(&this->pnaNet,uVar9);
      if (*(NaPetriNode **)CONCAT44(extraout_var,iVar1) == pNode) {
        return;
      }
      uVar8 = (int)uVar9 + 1;
      uVar9 = (ulong)uVar8;
    } while ((int)uVar8 < (this->pnaNet).nItems);
  }
  if (this->fpDig != (FILE *)0x0) {
    iVar1 = NaPetriNode::connectors(pNode);
    if (0 < iVar1) {
      pFVar11 = (FILE *)this->fpDig;
      pcVar4 = NaPetriNode::name(pNode);
      pcVar5 = NaPetriNode::name(pNode);
      iVar12 = 0;
      fprintf(pFVar11,"  %s [\n    label=\"%s|{",pcVar4,pcVar5);
      iVar1 = NaPetriNode::connectors(pNode);
      if (0 < iVar1) {
        iVar12 = 0;
        iVar1 = 0;
        do {
          pNVar6 = NaPetriNode::connector(pNode,iVar1);
          iVar2 = (*pNVar6->_vptr_NaPetriConnector[7])(pNVar6);
          if (iVar2 == 0) {
            pFVar11 = (FILE *)this->fpDig;
            pcVar4 = NaPetriConnector::name(pNVar6);
            pcVar5 = NaPetriConnector::name(pNVar6);
            pcVar10 = "|<%s>%s";
            if (iVar12 == 0) {
              pcVar10 = "{<%s>%s";
            }
            fprintf(pFVar11,pcVar10,pcVar4,pcVar5);
            iVar12 = iVar12 + 1;
          }
          iVar1 = iVar1 + 1;
          iVar2 = NaPetriNode::connectors(pNode);
        } while (iVar1 < iVar2);
        if (0 < iVar12) {
          fputc(0x7d,(FILE *)this->fpDig);
          iVar12 = 1;
        }
      }
      iVar1 = NaPetriNode::connectors(pNode);
      if (0 < iVar1) {
        iVar1 = 0;
        iVar2 = 0;
        do {
          pNVar6 = NaPetriNode::connector(pNode,iVar1);
          iVar3 = (*pNVar6->_vptr_NaPetriConnector[7])(pNVar6);
          if (iVar3 == 1) {
            if (iVar2 == 0 && iVar12 == 0) {
              pFVar11 = (FILE *)this->fpDig;
              pcVar4 = NaPetriConnector::name(pNVar6);
              pcVar5 = NaPetriConnector::name(pNVar6);
              pcVar10 = "{<%s>%s";
            }
            else {
              pFVar11 = (FILE *)this->fpDig;
              pcVar4 = NaPetriConnector::name(pNVar6);
              pcVar5 = NaPetriConnector::name(pNVar6);
              if (iVar2 == 0) {
                pcVar10 = "|{<%s>%s";
              }
              else {
                pcVar10 = "|<%s>%s";
              }
            }
            fprintf(pFVar11,pcVar10,pcVar4,pcVar5);
            iVar2 = iVar2 + 1;
          }
          iVar1 = iVar1 + 1;
          iVar3 = NaPetriNode::connectors(pNode);
        } while (iVar1 < iVar3);
        if (0 < iVar2) {
          fputc(0x7d,(FILE *)this->fpDig);
        }
      }
      fwrite("}\"\n  ] ;\n",9,1,(FILE *)this->fpDig);
    }
  }
  pcVar4 = this->szName;
  pcVar5 = NaPetriNode::name(pNode);
  NaPrintLog(" %s: + %s node\n",pcVar4,pcVar5);
  puVar7 = (undefined8 *)operator_new(8);
  *puVar7 = pNode;
  (*(this->pnaNet)._vptr_NaDynAr[4])(&this->pnaNet,puVar7);
  pNode->pNet = this;
  (*pNode->_vptr_NaPetriNode[10])(pNode);
  return;
}

Assistant:

void
NaPetriNet::add (NaPetriNode* pNode)
{
    if(ask_for_node(pNode)){
        // Don't add the same node twice
        return;
    }

    if(NULL != fpDig) {
	if(pNode->connectors() > 0) {
	    fprintf(fpDig, "  %s [\n    label=\"%s|{",
		    pNode->name(), pNode->name());
	    int nInputs = 0;
	    for(int i = 0; i < pNode->connectors(); ++i) {
		NaPetriConnector *pCn = pNode->connector(i);
		if(pckInput == pCn->kind()) {
		    if(0 == nInputs)
			fprintf(fpDig, "{<%s>%s", pCn->name(), pCn->name());
		    else
			fprintf(fpDig, "|<%s>%s", pCn->name(), pCn->name());
		    ++nInputs;
		}
	    }
	    if(nInputs > 0)
		fprintf(fpDig, "}");
	    int nOutputs = 0;
	    for(int i = 0; i < pNode->connectors(); ++i) {
		NaPetriConnector *pCn = pNode->connector(i);
		if(pckOutput == pCn->kind()) {
		    if(0 == nOutputs && 0 == nInputs)
			fprintf(fpDig, "{<%s>%s", pCn->name(), pCn->name());
		    else if(0 == nOutputs)
			fprintf(fpDig, "|{<%s>%s", pCn->name(), pCn->name());
		    else
			fprintf(fpDig, "|<%s>%s", pCn->name(), pCn->name());
		    ++nOutputs;
		}
	    }
	    if(nOutputs > 0)
		fprintf(fpDig, "}");
	    fprintf(fpDig, "}\"\n  ] ;\n");
	}
    }

    NaPrintLog(" %s: + %s node\n", name(), pNode->name());

    pnaNet.addh(pNode);

    // Setup pointer to the network
    pNode->pNet = this;

    // Perform some actions in new attendee
    pNode->attend_network();
}